

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O0

boolean find_defensive(monst *mtmp,musable *m)

{
  level *lev_00;
  xchar xVar1;
  boolean bVar2;
  int x0;
  int y0;
  int iVar3;
  obj *poVar4;
  trap *ptVar5;
  monuse mVar6;
  bool bVar7;
  bool bVar8;
  monst *local_70;
  int local_64;
  monst *mon;
  int yy_1;
  int xx_1;
  int yy;
  int xx;
  int fraction;
  boolean immobile;
  boolean stuck;
  level *lev;
  int y;
  int x;
  trap *t;
  obj *obj;
  musable *m_local;
  monst *mtmp_local;
  
  t = (trap *)0x0;
  x0 = (int)mtmp->mx;
  y0 = (int)mtmp->my;
  lev_00 = mtmp->dlevel;
  bVar7 = mtmp == u.ustuck;
  bVar8 = mtmp->data->mmove == '\0';
  if (((mtmp->data->mflags1 & 0x40000) == 0) && ((mtmp->data->mflags1 & 0x10000) == 0)) {
    iVar3 = dist2(x0,y0,(int)mtmp->mux,(int)mtmp->muy);
    if (iVar3 < 0x1a) {
      if (((u._1052_1_ & 1) == 0) || (!bVar7)) {
        m->defensive = (obj *)0x0;
        m->has_defense = MUSE_NONE;
        if (((*(uint *)&mtmp->field_0x60 >> 0x15 & 1) != 0) ||
           (((*(uint *)&mtmp->field_0x60 >> 0x14 & 1) != 0 ||
            ((*(uint *)&mtmp->field_0x60 >> 0x11 & 1) == 0)))) {
          if (((mtmp->data->mlet != '\x15') || ((mtmp->data->mflags2 & 0x20000000) == 0)) &&
             ((mtmp->data->mflags1 & 0x2000) == 0)) {
            t = (trap *)mtmp->minvent;
            while ((t != (trap *)0x0 &&
                   ((*(short *)&t[1].field_0x12 != 0x10a || (((ulong)t[3].ntrap & 0x10000) != 0)))))
            {
              t = t->ntrap;
            }
          }
          if ((t != (trap *)0x0) ||
             ((mtmp->data->mlet == '\x15' && ((mtmp->data->mflags2 & 0x20000000) != 0)))) {
            m->defensive = (obj *)t;
            m->has_defense = MUSE_UNICORN_HORN;
            return '\x01';
          }
        }
        if ((*(uint *)&mtmp->field_0x60 >> 0x15 & 1) != 0) {
          for (t = (trap *)mtmp->minvent; t != (trap *)0x0; t = t->ntrap) {
            if ((*(short *)&t[1].field_0x12 == 0x10e) && (*(int *)&t[3].field_0x8 == 0x154)) {
              m->defensive = (obj *)t;
              m->has_defense = MUSE_LIZARD_CORPSE;
              return '\x01';
            }
          }
        }
        if ((((*(uint *)&mtmp->field_0x60 >> 0x11 & 1) == 0) &&
            ((mtmp->data->mflags1 & 0x2000) == 0)) && (mtmp->data != mons + 0x145)) {
          poVar4 = m_carrying(mtmp,300);
          if (poVar4 != (obj *)0x0) {
            m->defensive = poVar4;
            m->has_defense = MUSE_POT_FULL_HEALING;
            return '\x01';
          }
          poVar4 = m_carrying(mtmp,0x136);
          if (poVar4 != (obj *)0x0) {
            m->defensive = poVar4;
            m->has_defense = MUSE_POT_EXTRA_HEALING;
            return '\x01';
          }
          poVar4 = m_carrying(mtmp,0x131);
          if (poVar4 != (obj *)0x0) {
            m->defensive = poVar4;
            m->has_defense = MUSE_POT_HEALING;
            return '\x01';
          }
        }
        if (u.ulevel < 10) {
          local_64 = 5;
        }
        else {
          local_64 = 3;
          if (u.ulevel < 0xe) {
            local_64 = 4;
          }
        }
        if ((mtmp->mhp < mtmp->mhpmax) &&
           ((mtmp->mhp < 10 || (mtmp->mhp * local_64 < mtmp->mhpmax)))) {
          if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
            if (((lev_00->locations[x0][y0].typ != '\x1a') || (bVar7)) || (bVar8)) {
              if (((lev_00->locations[x0][y0].typ != '\x1b') || (bVar7)) || (bVar8)) {
                if ((((lev_00->sstairs).sx == '\0') || ((lev_00->sstairs).sx != x0)) ||
                   ((lev_00->sstairs).sy != y0)) {
                  if ((!bVar7) && (!bVar8)) {
                    for (xx_1 = x0 + -1; xx_1 <= x0 + 1; xx_1 = xx_1 + 1) {
                      for (yy_1 = y0 + -1; yy_1 <= y0 + 1; yy_1 = yy_1 + 1) {
                        if (((((((((0 < xx_1) && (xx_1 < 0x50)) && (-1 < yy_1)) &&
                                ((yy_1 < 0x15 && (xx_1 != u.ux)))) && (yy_1 != u.uy)) &&
                              (((mtmp->data != mons + 0x78 || (xx_1 == x0)) || (yy_1 == y0)))) &&
                             ((((xx_1 == x0 && (yy_1 == y0)) ||
                               (lev_00->monsters[xx_1][yy_1] == (monst *)0x0)) &&
                              (ptVar5 = t_at(lev_00,xx_1,yy_1), ptVar5 != (trap *)0x0)))) &&
                            (((mtmp->data->msize == '\0' || ((mtmp->data->mflags2 & 0x8000000) != 0)
                              ) || (((mtmp->data->mflags1 & 8) != 0 ||
                                    (poVar4 = sobj_at(0x214,lev_00,xx_1,yy_1), poVar4 == (obj *)0x0)
                                    ))))) && (bVar2 = onscary(xx_1,yy_1,mtmp), bVar2 == '\0')) {
                          if ((((ptVar5->field_0x8 & 0x1f) == 0xe) ||
                              ((ptVar5->field_0x8 & 0x1f) == 0xd)) &&
                             (((mtmp->data->mlet != '\x05' &&
                               ((((*(uint *)&mtmp->field_0x60 >> 0x19 & 1) == 0 &&
                                 ((*(uint *)&mtmp->field_0x60 >> 0x1b & 1) == 0)) &&
                                ((*(uint *)&mtmp->field_0x60 >> 0x1c & 1) == 0)))) &&
                              (bVar2 = can_fall_thru(lev_00), bVar2 != '\0')))) {
                            trapx = xx_1;
                            trapy = yy_1;
                            m->has_defense = MUSE_TRAPDOOR;
                          }
                          else if (((ptVar5->field_0x8 & 0x1f) == 0x10) &&
                                  (m->has_defense != MUSE_TRAPDOOR)) {
                            trapx = xx_1;
                            trapy = yy_1;
                            m->has_defense = MUSE_TELEPORT_TRAP;
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  m->has_defense = MUSE_SSTAIRS;
                }
              }
              else {
                if ((x0 == (lev_00->upladder).sx) && (y0 == (lev_00->upladder).sy)) {
                  m->has_defense = MUSE_UP_LADDER;
                }
                if (((x0 == (lev_00->dnladder).sx) && (y0 == (lev_00->dnladder).sy)) &&
                   (mtmp->data->mlet != '\x05')) {
                  m->has_defense = MUSE_DN_LADDER;
                }
              }
            }
            else {
              if (((x0 == (lev_00->dnstair).sx) && (y0 == (lev_00->dnstair).sy)) &&
                 (mtmp->data->mlet != '\x05')) {
                m->has_defense = MUSE_DOWNSTAIRS;
              }
              if (((x0 == (lev_00->upstair).sx) && (y0 == (lev_00->upstair).sy)) &&
                 (xVar1 = ledger_no(&u.uz), xVar1 != '\x01')) {
                m->has_defense = MUSE_UPSTAIRS;
              }
            }
            if ((mtmp->data->mflags1 & 0x2000) == 0) {
              if (((mtmp->data->mflags2 & 0x400) != 0) &&
                 (poVar4 = m_carrying(mtmp,0x105), poVar4 != (obj *)0x0)) {
                for (mon._4_4_ = x0 + -3; mon._4_4_ <= x0 + 3; mon._4_4_ = mon._4_4_ + 1) {
                  for (mon._0_4_ = y0 + -3; (int)mon <= y0 + 3; mon._0_4_ = (int)mon + 1) {
                    if ((((0 < mon._4_4_) && (mon._4_4_ < 0x50)) && (-1 < (int)mon)) &&
                       ((int)mon < 0x15)) {
                      if ((lev_00->monsters[mon._4_4_][(int)mon] == (monst *)0x0) ||
                         ((*(uint *)&lev_00->monsters[mon._4_4_][(int)mon]->field_0x60 >> 9 & 1) !=
                          0)) {
                        local_70 = (monst *)0x0;
                      }
                      else {
                        local_70 = lev_00->monsters[mon._4_4_][(int)mon];
                      }
                      if (((local_70 != (monst *)0x0) && ((local_70->data->mflags2 & 0x400) != 0))
                         && ((local_70->data != (permonst *)0x3c4590 &&
                             (((*(uint *)&local_70->field_0x60 >> 0x13 & 1) != 0 ||
                              ((*(uint *)&local_70->field_0x60 >> 0x12 & 1) == 0)))))) {
                        m->defensive = poVar4;
                        m->has_defense = MUSE_BUGLE;
                      }
                    }
                  }
                }
              }
              if (m->has_defense == MUSE_NONE) {
                _y = t_at(lev_00,x0,y0);
                if ((_y != (trap *)0x0) &&
                   (((((_y->field_0x8 & 0x1f) == 0xb || ((_y->field_0x8 & 0x1f) == 0xc)) ||
                     ((_y->field_0x8 & 0x1f) == 0x13)) || ((_y->field_0x8 & 0x1f) == 5)))) {
                  _y = (trap *)0x0;
                }
                t = (trap *)mtmp->minvent;
                while (((t != (trap *)0x0 &&
                        ((m->has_defense == MUSE_NONE || (iVar3 = rn2(3), iVar3 != 0)))) &&
                       (m->has_defense != MUSE_WAN_DIGGING))) {
                  if ((((*(short *)&t[1].field_0x12 == 0x1cf) &&
                       ('\0' < *(char *)((long)&t[2].ntrap + 4))) &&
                      ((!bVar7 &&
                       (((_y == (trap *)0x0 && ((*(uint *)&mtmp->field_0x60 >> 0x19 & 1) == 0)) &&
                        ((*(uint *)&mtmp->field_0x60 >> 0x1b & 1) == 0)))))) &&
                     ((((((*(uint *)&mtmp->field_0x60 >> 0x1c & 1) == 0 &&
                         (mtmp->data->mlet != '\x05')) &&
                        (u.uz.dnum != dungeon_topology.d_sokoban_dnum)) &&
                       (((*(uint *)&lev_00->locations[x0][y0].field_0x6 >> 4 & 8) == 0 &&
                        (bVar2 = Is_botlevel(&u.uz), bVar2 == '\0')))) &&
                      ((u.uz.dnum != dungeon_topology.d_astral_level.dnum &&
                       ((((bVar2 = is_ice(lev_00,x0,y0), bVar2 == '\0' &&
                          (bVar2 = is_pool(lev_00,x0,y0), bVar2 == '\0')) &&
                         (bVar2 = is_lava(lev_00,x0,y0), bVar2 == '\0')) &&
                        ((mtmp->data != mons + 0xea || (bVar2 = In_V_tower(&u.uz), bVar2 == '\0'))))
                       )))))) {
                    m->defensive = (obj *)t;
                    m->has_defense = MUSE_WAN_DIGGING;
                  }
                  if ((m->has_defense != MUSE_WAN_TELEPORTATION_SELF) &&
                     (m->has_defense != MUSE_WAN_TELEPORTATION)) {
                    if (((*(short *)&t[1].field_0x12 == 0x1cb) &&
                        ('\0' < *(char *)((long)&t[2].ntrap + 4))) &&
                       (((*(uint *)&(lev_00->flags).field_0x8 >> 0xb & 1) == 0 ||
                        ((mtmp->mtrapseen & 0x8000) == 0)))) {
                      m->defensive = (obj *)t;
                      iVar3 = mon_has_amulet(mtmp);
                      mVar6 = MUSE_WAN_TELEPORTATION_SELF;
                      if (iVar3 != 0) {
                        mVar6 = MUSE_WAN_TELEPORTATION;
                      }
                      m->has_defense = mVar6;
                    }
                    if (m->has_defense != MUSE_SCR_TELEPORTATION) {
                      if (((((*(short *)&t[1].field_0x12 == 0x15c) &&
                            ((*(uint *)&mtmp->field_0x60 >> 0x11 & 1) != 0)) &&
                           ((mtmp->data->mflags1 & 0x1000) == 0)) &&
                          ((((ulong)t[3].ntrap & 0x10000) == 0 ||
                           ((((*(uint *)&mtmp->field_0x60 >> 0x19 & 1) == 0 ||
                             (iVar3 = inhishop(mtmp), iVar3 == 0)) &&
                            (((*(uint *)&mtmp->field_0x60 >> 0x1b & 1) == 0 &&
                             ((*(uint *)&mtmp->field_0x60 >> 0x1c & 1) == 0)))))))) &&
                         (((*(uint *)&(lev_00->flags).field_0x8 >> 0xb & 1) == 0 ||
                          ((mtmp->mtrapseen & 0x8000) == 0)))) {
                        m->defensive = (obj *)t;
                        m->has_defense = MUSE_SCR_TELEPORTATION;
                      }
                      if (mtmp->data == mons + 0x145) {
                        if (m->has_defense != MUSE_POT_FULL_HEALING) {
                          if (*(short *)&t[1].field_0x12 == 0x13f) {
                            m->defensive = (obj *)t;
                            m->has_defense = MUSE_POT_FULL_HEALING;
                          }
                          if (m->has_defense != MUSE_WAN_CREATE_MONSTER) {
                            if ((*(short *)&t[1].field_0x12 == 0x1c1) &&
                               ('\0' < *(char *)((long)&t[2].ntrap + 4))) {
                              m->defensive = (obj *)t;
                              m->has_defense = MUSE_WAN_CREATE_MONSTER;
                            }
LAB_00260a23:
                            if ((m->has_defense != MUSE_SCR_CREATE_MONSTER) &&
                               (*(short *)&t[1].field_0x12 == 0x158)) {
                              m->defensive = (obj *)t;
                              m->has_defense = MUSE_SCR_CREATE_MONSTER;
                            }
                          }
                        }
                      }
                      else if (m->has_defense != MUSE_POT_FULL_HEALING) {
                        if (*(short *)&t[1].field_0x12 == 300) {
                          m->defensive = (obj *)t;
                          m->has_defense = MUSE_POT_FULL_HEALING;
                        }
                        if (m->has_defense != MUSE_POT_EXTRA_HEALING) {
                          if (*(short *)&t[1].field_0x12 == 0x136) {
                            m->defensive = (obj *)t;
                            m->has_defense = MUSE_POT_EXTRA_HEALING;
                          }
                          if (m->has_defense != MUSE_WAN_CREATE_MONSTER) {
                            if ((*(short *)&t[1].field_0x12 == 0x1c1) &&
                               ('\0' < *(char *)((long)&t[2].ntrap + 4))) {
                              m->defensive = (obj *)t;
                              m->has_defense = MUSE_WAN_CREATE_MONSTER;
                            }
                            if (m->has_defense != MUSE_POT_HEALING) {
                              if (*(short *)&t[1].field_0x12 == 0x131) {
                                m->defensive = (obj *)t;
                                m->has_defense = MUSE_POT_HEALING;
                              }
                              if (m->has_defense != MUSE_POT_VAMPIRE_BLOOD) {
                                if (((mtmp->data->mlet == '0') ||
                                    ((mtmp->data->mflags2 & 0x100) != 0)) &&
                                   (*(short *)&t[1].field_0x12 == 0x151)) {
                                  m->defensive = (obj *)t;
                                  m->has_defense = MUSE_POT_VAMPIRE_BLOOD;
                                }
                                goto LAB_00260a23;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  t = t->ntrap;
                }
              }
            }
            mtmp_local._7_1_ = m->has_defense != MUSE_NONE;
          }
          else {
            if ((mtmp->data->mflags1 & 0x2000) == 0) {
              poVar4 = m_carrying(mtmp,300);
              if (poVar4 != (obj *)0x0) {
                m->defensive = poVar4;
                m->has_defense = MUSE_POT_FULL_HEALING;
                return '\x01';
              }
              poVar4 = m_carrying(mtmp,0x136);
              if (poVar4 != (obj *)0x0) {
                m->defensive = poVar4;
                m->has_defense = MUSE_POT_EXTRA_HEALING;
                return '\x01';
              }
              poVar4 = m_carrying(mtmp,0x131);
              if (poVar4 != (obj *)0x0) {
                m->defensive = poVar4;
                m->has_defense = MUSE_POT_HEALING;
                return '\x01';
              }
              if (((mtmp->data->mlet == '0') || ((mtmp->data->mflags2 & 0x100) != 0)) &&
                 (poVar4 = m_carrying(mtmp,0x151), poVar4 != (obj *)0x0)) {
                m->defensive = poVar4;
                m->has_defense = MUSE_POT_VAMPIRE_BLOOD;
                return '\x01';
              }
            }
            mtmp_local._7_1_ = false;
          }
        }
        else {
          mtmp_local._7_1_ = false;
        }
      }
      else {
        mtmp_local._7_1_ = false;
      }
    }
    else {
      mtmp_local._7_1_ = false;
    }
  }
  else {
    mtmp_local._7_1_ = false;
  }
  return mtmp_local._7_1_;
}

Assistant:

boolean find_defensive(struct monst *mtmp, struct musable *m)
{
	struct obj *obj = 0;
	struct trap *t;
	int x=mtmp->mx, y=mtmp->my;
	struct level *lev = mtmp->dlevel;
	boolean stuck = (mtmp == u.ustuck);
	boolean immobile = (mtmp->data->mmove == 0);
	int fraction;

	if (is_animal(mtmp->data) || mindless(mtmp->data))
		return FALSE;
	if (dist2(x, y, mtmp->mux, mtmp->muy) > 25)
		return FALSE;
	if (u.uswallow && stuck) return FALSE;

	m->defensive = NULL;
	m->has_defense = 0;

	/* since unicorn horns don't get used up, the monster would look
	 * silly trying to use the same cursed horn round after round
	 */
	if (mtmp->mconf || mtmp->mstun || !mtmp->mcansee) {
	    if (!is_unicorn(mtmp->data) && !nohands(mtmp->data)) {
		for (obj = mtmp->minvent; obj; obj = obj->nobj)
		    if (obj->otyp == UNICORN_HORN && !obj->cursed)
			break;
	    }
	    if (obj || is_unicorn(mtmp->data)) {
		m->defensive = obj;
		m->has_defense = MUSE_UNICORN_HORN;
		return TRUE;
	    }
	}

	if (mtmp->mconf) {
	    for (obj = mtmp->minvent; obj; obj = obj->nobj) {
		if (obj->otyp == CORPSE && obj->corpsenm == PM_LIZARD) {
		    m->defensive = obj;
		    m->has_defense = MUSE_LIZARD_CORPSE;
		    return TRUE;
		}
	    }
	}

	/* It so happens there are two unrelated cases when we might want to
	 * check specifically for healing alone.  The first is when the monster
	 * is blind (healing cures blindness).  The second is when the monster
	 * is peaceful; then we don't want to flee the player, and by
	 * coincidence healing is all there is that doesn't involve fleeing.
	 * These would be hard to combine because of the control flow.
	 * Pestilence won't use healing even when blind.
	 */
	if (!mtmp->mcansee && !nohands(mtmp->data) &&
		mtmp->data != &mons[PM_PESTILENCE]) {
	    if ((obj = m_carrying(mtmp, POT_FULL_HEALING)) != 0) {
		m->defensive = obj;
		m->has_defense = MUSE_POT_FULL_HEALING;
		return TRUE;
	    }
	    if ((obj = m_carrying(mtmp, POT_EXTRA_HEALING)) != 0) {
		m->defensive = obj;
		m->has_defense = MUSE_POT_EXTRA_HEALING;
		return TRUE;
	    }
	    if ((obj = m_carrying(mtmp, POT_HEALING)) != 0) {
		m->defensive = obj;
		m->has_defense = MUSE_POT_HEALING;
		return TRUE;
	    }
	}

	fraction = u.ulevel < 10 ? 5 : u.ulevel < 14 ? 4 : 3;
	if (mtmp->mhp >= mtmp->mhpmax ||
			(mtmp->mhp >= 10 && mtmp->mhp*fraction >= mtmp->mhpmax))
		return FALSE;

	if (mtmp->mpeaceful) {
	    if (!nohands(mtmp->data)) {
		if ((obj = m_carrying(mtmp, POT_FULL_HEALING)) != 0) {
		    m->defensive = obj;
		    m->has_defense = MUSE_POT_FULL_HEALING;
		    return TRUE;
		}
		if ((obj = m_carrying(mtmp, POT_EXTRA_HEALING)) != 0) {
		    m->defensive = obj;
		    m->has_defense = MUSE_POT_EXTRA_HEALING;
		    return TRUE;
		}
		if ((obj = m_carrying(mtmp, POT_HEALING)) != 0) {
		    m->defensive = obj;
		    m->has_defense = MUSE_POT_HEALING;
		    return TRUE;
		}
		if (is_vampire(mtmp->data) &&
		    (obj = m_carrying(mtmp, POT_VAMPIRE_BLOOD)) != 0) {
		    m->defensive = obj;
		    m->has_defense = MUSE_POT_VAMPIRE_BLOOD;
		    return TRUE;
		}
	    }
	    return FALSE;
	}

	if (lev->locations[x][y].typ == STAIRS && !stuck && !immobile) {
		if (x == lev->dnstair.sx && y == lev->dnstair.sy && !is_floater(mtmp->data))
			m->has_defense = MUSE_DOWNSTAIRS;
		if (x == lev->upstair.sx && y == lev->upstair.sy && ledger_no(&u.uz) != 1)
	/* Unfair to let the monsters leave the dungeon with the Amulet */
	/* (or go to the endlevel since you also need it, to get there) */
			m->has_defense = MUSE_UPSTAIRS;
	} else if (lev->locations[x][y].typ == LADDER && !stuck && !immobile) {
		if (x == lev->upladder.sx && y == lev->upladder.sy)
			m->has_defense = MUSE_UP_LADDER;
		if (x == lev->dnladder.sx && y == lev->dnladder.sy && !is_floater(mtmp->data))
			m->has_defense = MUSE_DN_LADDER;
	} else if (lev->sstairs.sx && lev->sstairs.sx == x && lev->sstairs.sy == y) {
		m->has_defense = MUSE_SSTAIRS;
	} else if (!stuck && !immobile) {
	/* Note: trap doors take precedence over teleport traps. */
		int xx, yy;

		for (xx = x-1; xx <= x+1; xx++) for(yy = y-1; yy <= y+1; yy++)
		if (isok(xx,yy))
		if (xx != u.ux && yy != u.uy)
		if (mtmp->data != &mons[PM_GRID_BUG] || xx == x || yy == y)
		if ((xx==x && yy==y) || !lev->monsters[xx][yy])
		if ((t = t_at(lev, xx,yy)) != 0)
		if ((verysmall(mtmp->data) || throws_rocks(mtmp->data) ||
		     passes_walls(mtmp->data)) || !sobj_at(BOULDER, lev, xx, yy))
		if (!onscary(xx,yy,mtmp)) {
			if ((t->ttyp == TRAPDOOR || t->ttyp == HOLE)
				&& !is_floater(mtmp->data)
				&& !mtmp->isshk && !mtmp->isgd
				&& !mtmp->ispriest
				&& can_fall_thru(lev)) {
				trapx = xx;
				trapy = yy;
				m->has_defense = MUSE_TRAPDOOR;
			} else if (t->ttyp == TELEP_TRAP && m->has_defense != MUSE_TRAPDOOR) {
				trapx = xx;
				trapy = yy;
				m->has_defense = MUSE_TELEPORT_TRAP;
			}
		}
	}

	if (nohands(mtmp->data))	/* can't use objects */
		goto botm;

	if (is_mercenary(mtmp->data) && (obj = m_carrying(mtmp, BUGLE))) {
		int xx, yy;
		struct monst *mon;

		/* Distance is arbitrary.  What we really want to do is
		 * have the soldier play the bugle when it sees or
		 * remembers soldiers nearby...
		 */
		for (xx = x-3; xx <= x+3; xx++) for(yy = y-3; yy <= y+3; yy++)
		if (isok(xx,yy))
		if ((mon = m_at(lev, xx,yy)) && is_mercenary(mon->data) &&
				mon->data != &mons[PM_GUARD] &&
				(mon->msleeping || (!mon->mcanmove))) {
			m->defensive = obj;
			m->has_defense = MUSE_BUGLE;
		}
	}

	/* use immediate physical escape prior to attempting magic */
	if (m->has_defense)    /* stairs, trap door or tele-trap, bugle alert */
		goto botm;

	/* kludge to cut down on trap destruction (particularly portals) */
	t = t_at(lev, x,y);
	if (t && (t->ttyp == PIT || t->ttyp == SPIKED_PIT ||
		  t->ttyp == WEB || t->ttyp == BEAR_TRAP))
		t = 0;		/* ok for monster to dig here */

#define nomore(x) if (m->has_defense==x) continue;
	for (obj = mtmp->minvent; obj; obj = obj->nobj) {
		/* don't always use the same selection pattern */
		if (m->has_defense && !rn2(3)) break;

		/* nomore(MUSE_WAN_DIGGING); */
		if (m->has_defense == MUSE_WAN_DIGGING) break;
		if (obj->otyp == WAN_DIGGING && obj->spe > 0 && !stuck && !t
		    && !mtmp->isshk && !mtmp->isgd && !mtmp->ispriest
		    && !is_floater(mtmp->data)
		    /* monsters digging in Sokoban can ruin things */
		    && !In_sokoban(&u.uz)
		    /* digging wouldn't be effective; assume they know that */
		    && !(lev->locations[x][y].wall_info & W_NONDIGGABLE)
		    && !(Is_botlevel(&u.uz) || In_endgame(&u.uz))
		    && !(is_ice(lev, x,y) || is_pool(lev, x,y) || is_lava(lev, x,y))
		    && !(mtmp->data == &mons[PM_VLAD_THE_IMPALER]
			 && In_V_tower(&u.uz))) {
			m->defensive = obj;
			m->has_defense = MUSE_WAN_DIGGING;
		}
		nomore(MUSE_WAN_TELEPORTATION_SELF);
		nomore(MUSE_WAN_TELEPORTATION);
		if (obj->otyp == WAN_TELEPORTATION && obj->spe > 0) {
		    /* use the TELEP_TRAP bit to determine if they know
		     * about noteleport on this level or not.  Avoids
		     * ineffective re-use of teleportation.  This does
		     * mean if the monster leaves the level, they'll know
		     * about teleport traps.
		     */
		    if (!lev->flags.noteleport ||
			!(mtmp->mtrapseen & (1 << (TELEP_TRAP-1)))) {
			m->defensive = obj;
			m->has_defense = (mon_has_amulet(mtmp))
				? MUSE_WAN_TELEPORTATION
				: MUSE_WAN_TELEPORTATION_SELF;
		    }
		}
		nomore(MUSE_SCR_TELEPORTATION);
		if (obj->otyp == SCR_TELEPORTATION && mtmp->mcansee
		   && haseyes(mtmp->data)
		   && (!obj->cursed ||
		       (!(mtmp->isshk && inhishop(mtmp))
			    && !mtmp->isgd && !mtmp->ispriest))) {
		    /* see WAN_TELEPORTATION case above */
		    if (!lev->flags.noteleport ||
			!(mtmp->mtrapseen & (1 << (TELEP_TRAP-1)))) {
			m->defensive = obj;
			m->has_defense = MUSE_SCR_TELEPORTATION;
		    }
		}

	    if (mtmp->data != &mons[PM_PESTILENCE]) {
		nomore(MUSE_POT_FULL_HEALING);
		if (obj->otyp == POT_FULL_HEALING) {
			m->defensive = obj;
			m->has_defense = MUSE_POT_FULL_HEALING;
		}
		nomore(MUSE_POT_EXTRA_HEALING);
		if (obj->otyp == POT_EXTRA_HEALING) {
			m->defensive = obj;
			m->has_defense = MUSE_POT_EXTRA_HEALING;
		}
		nomore(MUSE_WAN_CREATE_MONSTER);
		if (obj->otyp == WAN_CREATE_MONSTER && obj->spe > 0) {
			m->defensive = obj;
			m->has_defense = MUSE_WAN_CREATE_MONSTER;
		}
		nomore(MUSE_POT_HEALING);
		if (obj->otyp == POT_HEALING) {
			m->defensive = obj;
			m->has_defense = MUSE_POT_HEALING;
		}
		nomore(MUSE_POT_VAMPIRE_BLOOD);
		if (is_vampire(mtmp->data) && obj->otyp == POT_VAMPIRE_BLOOD) {
			m->defensive = obj;
			m->has_defense = MUSE_POT_VAMPIRE_BLOOD;
		}
	    } else {	/* Pestilence */
		nomore(MUSE_POT_FULL_HEALING);
		if (obj->otyp == POT_SICKNESS) {
			m->defensive = obj;
			m->has_defense = MUSE_POT_FULL_HEALING;
		}
		nomore(MUSE_WAN_CREATE_MONSTER);
		if (obj->otyp == WAN_CREATE_MONSTER && obj->spe > 0) {
			m->defensive = obj;
			m->has_defense = MUSE_WAN_CREATE_MONSTER;
		}
	    }
		nomore(MUSE_SCR_CREATE_MONSTER);
		if (obj->otyp == SCR_CREATE_MONSTER) {
			m->defensive = obj;
			m->has_defense = MUSE_SCR_CREATE_MONSTER;
		}
	}
botm:	return (boolean)(!!m->has_defense);
#undef nomore
}